

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sigproc.cc
# Opt level: O3

void sptk::snack::crossf(float *data,int size,int start,int nlags,float *engref,int *maxloc,
                        float *maxval,float *correl,int *dbsizep,float **dbdatap)

{
  float *pfVar1;
  float *__ptr;
  int iVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  float *pfVar6;
  ulong uVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  double dVar11;
  float fVar12;
  double dVar13;
  double dVar14;
  
  __ptr = *dbdatap;
  iVar5 = size + start + nlags;
  if (*dbsizep < iVar5) {
    if (__ptr != (float *)0x0) {
      free(__ptr);
    }
    __ptr = (float *)malloc((long)iVar5 << 2);
    if (__ptr == (float *)0x0) {
      crossf();
      return;
    }
    *dbdatap = __ptr;
    *dbsizep = iVar5;
  }
  fVar8 = 0.0;
  if (size != 0) {
    lVar3 = 0;
    do {
      fVar8 = fVar8 + data[lVar3];
      lVar3 = lVar3 + 1;
    } while (size != (int)lVar3);
  }
  if (iVar5 != 0) {
    lVar3 = 0;
    do {
      __ptr[lVar3] = data[lVar3] - fVar8 / (float)size;
      lVar3 = lVar3 + 1;
    } while ((int)lVar3 != nlags + start + size);
  }
  if (size == 0) {
    *engref = 0.0;
  }
  else {
    fVar8 = 0.0;
    lVar3 = 0;
    do {
      fVar8 = fVar8 + __ptr[lVar3] * __ptr[lVar3];
      lVar3 = lVar3 + 1;
    } while (size != (int)lVar3);
    *engref = fVar8;
    fVar12 = 0.0;
    if (0.0 < fVar8) {
      lVar3 = (long)start;
      if (size == 0) {
        dVar14 = 0.0;
      }
      else {
        lVar4 = 0;
        do {
          fVar12 = fVar12 + __ptr[lVar3 + lVar4] * __ptr[lVar3 + lVar4];
          lVar4 = lVar4 + 1;
        } while (size != (int)lVar4);
        dVar14 = (double)fVar12;
      }
      if (nlags < 1) {
        iVar5 = -1;
        fVar12 = 0.0;
      }
      else {
        lVar4 = lVar3 << 2;
        fVar12 = 0.0;
        iVar5 = -1;
        uVar7 = 0;
        do {
          dVar13 = 0.0;
          pfVar6 = __ptr + lVar3 + uVar7;
          if (size != 0) {
            fVar9 = 0.0;
            pfVar6 = __ptr;
            iVar2 = size;
            do {
              fVar10 = *pfVar6;
              pfVar1 = (float *)((long)pfVar6 + lVar4);
              pfVar6 = pfVar6 + 1;
              fVar9 = fVar9 + fVar10 * *pfVar1;
              iVar2 = iVar2 + -1;
            } while (iVar2 != 0);
            dVar13 = (double)fVar9;
            pfVar6 = (float *)((long)pfVar6 + lVar4);
          }
          dVar11 = dVar14 * (double)fVar8;
          if (dVar11 < 0.0) {
            dVar11 = sqrt(dVar11);
          }
          else {
            dVar11 = SQRT(dVar11);
          }
          fVar10 = (float)(dVar13 / dVar11);
          *correl = fVar10;
          correl = correl + 1;
          fVar9 = __ptr[lVar3 + uVar7];
          dVar13 = (double)(*pfVar6 * *pfVar6) + (dVar14 - (double)(fVar9 * fVar9));
          dVar14 = 1.0;
          if (1.0 <= dVar13) {
            dVar14 = dVar13;
          }
          if (fVar12 < fVar10) {
            iVar5 = (int)uVar7 + start;
            fVar12 = fVar10;
          }
          uVar7 = uVar7 + 1;
          lVar4 = lVar4 + 4;
        } while (uVar7 != (uint)nlags);
      }
      *maxloc = iVar5;
      *maxval = fVar12;
      return;
    }
  }
  *maxloc = 0;
  *maxval = 0.0;
  if (nlags < 1) {
    return;
  }
  memset(correl,0,(ulong)(uint)nlags << 2);
  return;
}

Assistant:

void crossf(float *data, int size, int start, int nlags, float *engref,
            int *maxloc, float *maxval, float *correl, int *dbsizep,
            float **dbdatap)
#endif
{
#if 0
  static float *dbdata=NULL;
  static int dbsize = 0;
#else
  float *dbdata=*dbdatap;
  int dbsize = *dbsizep;
#endif
  register float *dp, *ds, sum, st;
  register int j;
  register  float *dq, t, *p, engr, *dds, amax;
  register  double engc;
  int i, iloc, total;
#if 0
  int sizei, sizeo, maxsize;
#endif

  /* Compute mean in reference window and subtract this from the
     entire sequence.  This doesn't do too much damage to the data
     sequenced for the purposes of F0 estimation and removes the need for
     more principled (and costly) low-cut filtering. */
  if((total = size+start+nlags) > dbsize) {
    if(dbdata)
      ckfree((void *)dbdata);
    dbdata = NULL;
    dbsize = 0;
    if(!(dbdata = (float*)ckalloc(sizeof(float)*total))) {
      Fprintf(stderr,"Allocation failure in crossf()\n");
      return;/*exit(-1);*/
    }
    dbsize = total;
#if 1
    *dbdatap = dbdata;
    *dbsizep = dbsize;
#endif
  }
  for(engr=0.0, j=size, p=data; j--; ) engr += *p++;
  engr /= size;
  for(j=size+nlags+start, dq = dbdata, p=data; j--; )  *dq++ = *p++ - engr;

#if 0
  maxsize = start + nlags;
  sizei = size + start + nlags + 1;
  sizeo = nlags + 1;
#endif
 
  /* Compute energy in reference window. */
  for(j=size, dp=dbdata, sum=0.0; j--; ) {
    st = *dp++;
    sum += st * st;
  }

  *engref = engr = sum;
  if(engr > 0.0) {    /* If there is any signal energy to work with... */
    /* Compute energy at the first requested lag. */  
    for(j=size, dp=dbdata+start, sum=0.0; j--; ) {
      st = *dp++;
      sum += st * st;
    }
    engc = sum;

    /* COMPUTE CORRELATIONS AT ALL OTHER REQUESTED LAGS. */
    for(i=0, dq=correl, amax=0.0, iloc = -1; i < nlags; i++) {
      for(j=size, sum=0.0, dp=dbdata, dds = ds = dbdata+i+start; j--; )
	sum += *dp++ * *ds++;
      *dq++ = t = (float) (sum/sqrt((double)(engc*engr))); /* output norm. CC */
      engc -= (double)(*dds * *dds); /* adjust norm. energy for next lag */
      if((engc += (double)(*ds * *ds)) < 1.0)
	engc = 1.0;		/* (hack: in case of roundoff error) */
      if(t > amax) {		/* Find abs. max. as we go. */
	amax = t;
	iloc = i+start;
      }
    }
    *maxloc = iloc;
    *maxval = amax;
  } else {	/* No energy in signal; fake reasonable return vals. */
    *maxloc = 0;
    *maxval = 0.0;
    for(p=correl,i=nlags; i-- > 0; )
      *p++ = 0.0;
  }
}